

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O2

ExtensionInfo *
google::protobuf::internal::anon_unknown_59::FindRegisteredExtension
          (MessageLite *extendee,int number)

{
  EnumValidityFuncWithArg *pEVar1;
  MessageLite *pMVar2;
  undefined1 (*pauVar3) [16];
  EnumValidityFuncWithArg *pEVar4;
  TcParseTableBase *pTVar5;
  undefined1 auVar6 [16];
  anon_union_8_1_a8a14541_for_iterator_2 common;
  bool bVar7;
  uint32_t uVar8;
  undefined1 (*pauVar9) [16];
  size_t hash;
  anon_union_8_1_a8a14541_for_iterator_2 aVar10;
  reference pEVar11;
  slot_type *slot;
  slot_type *slot_00;
  long lVar12;
  ulong extraout_RDX;
  ulong uVar13;
  void *pvVar14;
  ushort uVar15;
  undefined4 uVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  __m128i match;
  ctrl_t cVar19;
  code cVar21;
  code cVar22;
  code cVar23;
  code cVar24;
  code cVar25;
  code cVar26;
  code cVar27;
  code cVar28;
  code cVar29;
  code cVar30;
  code cVar31;
  code cVar32;
  code cVar33;
  code cVar34;
  code cVar35;
  undefined1 auVar20 [16];
  const_iterator it;
  ExtensionInfoKey info;
  anon_class_24_3_2b146c49 local_a0;
  MessageLite *local_88;
  int local_80 [2];
  undefined1 local_78 [16];
  const_iterator local_60;
  undefined1 local_50 [10];
  undefined1 uStack_46;
  undefined1 uStack_45;
  undefined1 uStack_44;
  undefined1 uStack_43;
  undefined1 uStack_42;
  undefined1 uStack_41;
  undefined1 uStack_40;
  undefined1 uStack_3f;
  undefined1 uStack_3e;
  undefined1 uStack_3d;
  undefined1 uStack_3c;
  undefined1 uStack_3b;
  undefined1 uStack_3a;
  undefined1 uStack_39;
  
  common.slot_ = (anonymous_namespace)::global_registry.slot_;
  if ((anonymous_namespace)::global_registry.slot_ != (slot_type *)0x0) {
    local_88 = extendee;
    local_80[0] = number;
    bVar7 = absl::lts_20250127::container_internal::
            raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>
            ::empty((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>
                     *)(anonymous_namespace)::global_registry.slot_);
    if (!bVar7) {
      local_50._0_8_ =
           absl::lts_20250127::HashOf<const_google::protobuf::MessageLite_*,_int>
                     (&local_88,local_80);
      pMVar2 = (common.slot_)->message;
      if (pMVar2 < (MessageLite *)0x11) {
        pvVar14 = ((common.slot_)->field_6).enum_validity_check.arg;
        local_a0.this =
             (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>
              *)common.slot_;
        local_a0.key = (ExtensionInfoKey *)&local_88;
        local_a0.hash_of_arg = (size_t *)local_50;
        pauVar3 = (undefined1 (*) [16])((common.slot_)->field_6).enum_validity_check.func;
        if (pMVar2 < (MessageLite *)0xf) {
          if ((MessageLite *)0x8 < pMVar2) {
            __assert_fail("(cap <= GroupPortableImpl::kWidth && \"unexpectedly large small capacity\") && \"Try enabling sanitizers.\""
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                          ,0x78b,
                          "void absl::container_internal::IterateOverFullSlots(const CommonFields &, SlotType *, Callback) [SlotType = google::protobuf::internal::ExtensionInfo, Callback = (lambda at /workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h:4019:36)]"
                         );
          }
          local_60.inner_.ctrl_ = *(ctrl_t **)(*pauVar3 + (long)pMVar2);
          local_60.inner_.ctrl_ =
               (ctrl_t *)
               absl::lts_20250127::container_internal::GroupPortableImpl::MaskFull
                         ((GroupPortableImpl *)&local_60);
          for (; local_60.inner_.ctrl_ != (ctrl_t *)0x0;
              local_60.inner_.ctrl_ =
                   (ctrl_t *)((ulong)(local_60.inner_.ctrl_ + -1) & (ulong)local_60.inner_.ctrl_)) {
            uVar8 = absl::lts_20250127::container_internal::NonIterableBitMask<unsigned_long,_8,_3>
                    ::LowestBitSet((NonIterableBitMask<unsigned_long,_8,_3> *)&local_60);
            absl::lts_20250127::container_internal::
            raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>
            ::
            AssertHashEqConsistent<google::protobuf::internal::(anonymous_namespace)::ExtensionInfoKey>
            ::anon_class_24_3_2b146c49::operator()
                      (&local_a0,(ctrl_t *)((long)pvVar14 + (ulong)uVar8 * 0x30 + -0x30),slot);
          }
        }
        else {
          uVar13 = *(ulong *)&(common.slot_)->number >> 1;
          local_78._0_8_ = uVar13;
          while (pauVar9 = pauVar3, uVar13 != 0) {
            auVar17 = *pauVar9;
            for (uVar15 = ~((ushort)(SUB161(auVar17 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar17 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB161(auVar17 >> 0x17,0) & 1) << 2 |
                            (ushort)(SUB161(auVar17 >> 0x1f,0) & 1) << 3 |
                            (ushort)(SUB161(auVar17 >> 0x27,0) & 1) << 4 |
                            (ushort)(SUB161(auVar17 >> 0x2f,0) & 1) << 5 |
                            (ushort)(SUB161(auVar17 >> 0x37,0) & 1) << 6 |
                            (ushort)(SUB161(auVar17 >> 0x3f,0) & 1) << 7 |
                            (ushort)(SUB161(auVar17 >> 0x47,0) & 1) << 8 |
                            (ushort)(SUB161(auVar17 >> 0x4f,0) & 1) << 9 |
                            (ushort)(SUB161(auVar17 >> 0x57,0) & 1) << 10 |
                            (ushort)(SUB161(auVar17 >> 0x5f,0) & 1) << 0xb |
                            (ushort)(SUB161(auVar17 >> 0x67,0) & 1) << 0xc |
                            (ushort)(SUB161(auVar17 >> 0x6f,0) & 1) << 0xd |
                            (ushort)(SUB161(auVar17 >> 0x77,0) & 1) << 0xe |
                           (ushort)(byte)(auVar17[0xf] >> 7) << 0xf); uVar15 != 0;
                uVar15 = uVar15 - 1 & uVar15) {
              uVar8 = absl::lts_20250127::container_internal::TrailingZeros<unsigned_short>(uVar15);
              if ((char)(*pauVar9)[uVar8] < '\0') {
                __assert_fail("(IsFull(ctrl[i]) && \"hash table was modified unexpectedly\") && \"Try enabling sanitizers.\""
                              ,
                              "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                              ,0x79d,
                              "void absl::container_internal::IterateOverFullSlots(const CommonFields &, SlotType *, Callback) [SlotType = google::protobuf::internal::ExtensionInfo, Callback = (lambda at /workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h:4019:36)]"
                             );
              }
              absl::lts_20250127::container_internal::
              raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>
              ::
              AssertHashEqConsistent<google::protobuf::internal::(anonymous_namespace)::ExtensionInfoKey>
              ::anon_class_24_3_2b146c49::operator()
                        (&local_a0,(ctrl_t *)((ulong)uVar8 * 0x30 + (long)pvVar14),slot_00);
              uVar13 = uVar13 - 1;
            }
            pvVar14 = (void *)((long)pvVar14 + 0x300);
            pauVar3 = pauVar9 + 1;
            if ((uVar13 != 0) && ((*pauVar9)[0xf] == -1)) {
              __assert_fail("((remaining == 0 || *(ctrl - 1) != ctrl_t::kSentinel) && \"hash table was modified unexpectedly\") && \"Try enabling sanitizers.\""
                            ,
                            "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                            ,0x7a5,
                            "void absl::container_internal::IterateOverFullSlots(const CommonFields &, SlotType *, Callback) [SlotType = google::protobuf::internal::ExtensionInfo, Callback = (lambda at /workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h:4019:36)]"
                           );
            }
          }
          if ((ulong)local_78._0_8_ < *(ulong *)&(common.slot_)->number >> 1) {
            __assert_fail("(original_size_for_assert >= c.size() && \"hash table was modified unexpectedly\") && \"Try enabling sanitizers.\""
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                          ,0x7aa,
                          "void absl::container_internal::IterateOverFullSlots(const CommonFields &, SlotType *, Callback) [SlotType = google::protobuf::internal::ExtensionInfo, Callback = (lambda at /workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h:4019:36)]"
                         );
          }
        }
      }
    }
    absl::lts_20250127::container_internal::
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>
    ::AssertNotDebugCapacity
              ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>
                *)common.slot_);
    hash = absl::lts_20250127::HashOf<const_google::protobuf::MessageLite_*,_int>
                     (&local_88,local_80);
    absl::lts_20250127::container_internal::probe
              ((probe_seq<16UL> *)&local_a0,(CommonFields *)common.slot_,hash);
    pEVar4 = ((common.slot_)->field_6).enum_validity_check.func;
    auVar17 = ZEXT216(CONCAT11((char)hash,(char)hash) & 0x7f7f);
    auVar17 = pshuflw(auVar17,auVar17,0);
    uVar16 = auVar17._0_4_;
    auVar17._4_4_ = uVar16;
    auVar17._0_4_ = uVar16;
    auVar17._8_4_ = uVar16;
    auVar17._12_4_ = uVar16;
    aVar10 = (anon_union_8_1_a8a14541_for_iterator_2)local_a0.this;
    while( true ) {
      pEVar1 = pEVar4 + (long)&((CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>
                                 *)&(aVar10.slot_)->message)->
                               super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
      ;
      auVar18[0] = -((EnumValidityFuncWithArg)auVar17[0] == *pEVar1);
      auVar18[1] = -(auVar17[1] == pEVar1[1]);
      auVar18[2] = -(auVar17[2] == pEVar1[2]);
      auVar18[3] = -(auVar17[3] == pEVar1[3]);
      auVar18[4] = -(auVar17[4] == pEVar1[4]);
      auVar18[5] = -(auVar17[5] == pEVar1[5]);
      auVar18[6] = -(auVar17[6] == pEVar1[6]);
      auVar18[7] = -(auVar17[7] == pEVar1[7]);
      auVar18[8] = -(auVar17[8] == pEVar1[8]);
      auVar18[9] = -(auVar17[9] == pEVar1[9]);
      auVar18[10] = -(auVar17[10] == pEVar1[10]);
      auVar18[0xb] = -(auVar17[0xb] == pEVar1[0xb]);
      auVar18[0xc] = -(auVar17[0xc] == pEVar1[0xc]);
      auVar18[0xd] = -(auVar17[0xd] == pEVar1[0xd]);
      auVar18[0xe] = -(auVar17[0xe] == pEVar1[0xe]);
      auVar18[0xf] = -(auVar17[0xf] == pEVar1[0xf]);
      cVar19 = (ctrl_t)*pEVar1;
      cVar21 = pEVar1[1];
      cVar22 = pEVar1[2];
      cVar23 = pEVar1[3];
      cVar24 = pEVar1[4];
      cVar25 = pEVar1[5];
      cVar26 = pEVar1[6];
      cVar27 = pEVar1[7];
      cVar28 = pEVar1[8];
      cVar29 = pEVar1[9];
      cVar30 = pEVar1[10];
      cVar31 = pEVar1[0xb];
      cVar32 = pEVar1[0xc];
      cVar33 = pEVar1[0xd];
      cVar34 = pEVar1[0xe];
      cVar35 = pEVar1[0xf];
      for (uVar15 = (ushort)(SUB161(auVar18 >> 7,0) & 1) |
                    (ushort)(SUB161(auVar18 >> 0xf,0) & 1) << 1 |
                    (ushort)(SUB161(auVar18 >> 0x17,0) & 1) << 2 |
                    (ushort)(SUB161(auVar18 >> 0x1f,0) & 1) << 3 |
                    (ushort)(SUB161(auVar18 >> 0x27,0) & 1) << 4 |
                    (ushort)(SUB161(auVar18 >> 0x2f,0) & 1) << 5 |
                    (ushort)(SUB161(auVar18 >> 0x37,0) & 1) << 6 |
                    (ushort)(SUB161(auVar18 >> 0x3f,0) & 1) << 7 |
                    (ushort)(SUB161(auVar18 >> 0x47,0) & 1) << 8 |
                    (ushort)(SUB161(auVar18 >> 0x4f,0) & 1) << 9 |
                    (ushort)(SUB161(auVar18 >> 0x57,0) & 1) << 10 |
                    (ushort)(SUB161(auVar18 >> 0x5f,0) & 1) << 0xb |
                    (ushort)(SUB161(auVar18 >> 0x67,0) & 1) << 0xc |
                    (ushort)(SUB161(auVar18 >> 0x6f,0) & 1) << 0xd |
                    (ushort)(SUB161(auVar18 >> 0x77,0) & 1) << 0xe |
                    (ushort)(auVar18[0xf] >> 7) << 0xf; uVar15 != 0; uVar15 = uVar15 - 1 & uVar15) {
        local_78 = auVar17;
        local_50[8] = cVar19;
        local_50[9] = cVar21;
        uStack_46 = cVar22;
        uStack_45 = cVar23;
        uStack_44 = cVar24;
        uStack_43 = cVar25;
        uStack_42 = cVar26;
        uStack_41 = cVar27;
        uStack_40 = cVar28;
        uStack_3f = cVar29;
        uStack_3e = cVar30;
        uStack_3d = cVar31;
        uStack_3c = cVar32;
        uStack_3b = cVar33;
        uStack_3a = cVar34;
        uStack_39 = cVar35;
        uVar8 = absl::lts_20250127::container_internal::TrailingZeros<unsigned_short>(uVar15);
        pTVar5 = ((common.slot_)->field_6).message_info.tc_table;
        uVar13 = (long)&((local_a0.this)->settings_).
                        super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                        .
                        super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                        .value.capacity_ + (ulong)uVar8 & (ulong)local_a0.key;
        lVar12 = uVar13 * 0x30;
        if ((*(MessageLite **)((long)&pTVar5->has_bits_offset + lVar12) == local_88) &&
           (*(int *)((long)&pTVar5->fast_idx_mask + lVar12) == local_80[0])) {
          local_a0._0_16_ =
               absl::lts_20250127::container_internal::
               raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>
               ::iterator_at((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>
                              *)common.slot_,uVar13);
          goto LAB_001a01a4;
        }
        aVar10 = (anon_union_8_1_a8a14541_for_iterator_2)local_a0.this;
        auVar17 = local_78;
        cVar19 = local_50[8];
        cVar21 = local_50[9];
        cVar22 = uStack_46;
        cVar23 = uStack_45;
        cVar24 = uStack_44;
        cVar25 = uStack_43;
        cVar26 = uStack_42;
        cVar27 = uStack_41;
        cVar28 = uStack_40;
        cVar29 = uStack_3f;
        cVar30 = uStack_3e;
        cVar31 = uStack_3d;
        cVar32 = uStack_3c;
        cVar33 = uStack_3b;
        cVar34 = uStack_3a;
        cVar35 = uStack_39;
      }
      auVar20[0] = -(cVar19 == kEmpty);
      auVar20[1] = -(cVar21 == (code)0x80);
      auVar20[2] = -(cVar22 == (code)0x80);
      auVar20[3] = -(cVar23 == (code)0x80);
      auVar20[4] = -(cVar24 == (code)0x80);
      auVar20[5] = -(cVar25 == (code)0x80);
      auVar20[6] = -(cVar26 == (code)0x80);
      auVar20[7] = -(cVar27 == (code)0x80);
      auVar20[8] = -(cVar28 == (code)0x80);
      auVar20[9] = -(cVar29 == (code)0x80);
      auVar20[10] = -(cVar30 == (code)0x80);
      auVar20[0xb] = -(cVar31 == (code)0x80);
      auVar20[0xc] = -(cVar32 == (code)0x80);
      auVar20[0xd] = -(cVar33 == (code)0x80);
      auVar20[0xe] = -(cVar34 == (code)0x80);
      auVar20[0xf] = -(cVar35 == (code)0x80);
      if ((((((((((((((((auVar20 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                       (auVar20 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar20 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar20 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar20 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar20 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar20 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar20 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar20 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar20 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar20 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar20 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar20 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           (auVar20 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar20 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          cVar35 == (code)0x80) break;
      pMVar2 = (MessageLite *)((long)local_a0.hash_of_arg + 0x10);
      aVar10.slot_ = (slot_type *)
                     ((long)&((CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>
                               *)&(aVar10.slot_)->field_6)->
                             super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                      + (long)local_a0.hash_of_arg & (ulong)local_a0.key);
      local_a0.this =
           (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>
            *)aVar10.slot_;
      local_a0.hash_of_arg = (size_t *)pMVar2;
      if ((common.slot_)->message < pMVar2) {
        __assert_fail("(seq.index() <= capacity() && \"full table!\") && \"Try enabling sanitizers.\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                      ,0xe37,
                      "iterator absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>, google::protobuf::internal::(anonymous namespace)::ExtensionHasher, google::protobuf::internal::(anonymous namespace)::ExtensionEq, std::allocator<google::protobuf::internal::ExtensionInfo>>::find_non_soo(const key_arg<K> &, size_t) [Policy = absl::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>, Hash = google::protobuf::internal::(anonymous namespace)::ExtensionHasher, Eq = google::protobuf::internal::(anonymous namespace)::ExtensionEq, Alloc = std::allocator<google::protobuf::internal::ExtensionInfo>, K = google::protobuf::internal::(anonymous namespace)::ExtensionInfoKey]"
                     );
      }
    }
    absl::lts_20250127::container_internal::
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>
    ::AssertNotDebugCapacity
              ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>
                *)common.slot_);
    auVar6._8_8_ = 0;
    auVar6._0_8_ = extraout_RDX;
    local_a0._0_16_ = auVar6 << 0x40;
LAB_001a01a4:
    absl::lts_20250127::container_internal::
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>
    ::AssertNotDebugCapacity
              ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>
                *)(anonymous_namespace)::global_registry.slot_);
    local_60.inner_.ctrl_ = (ctrl_t *)0x0;
    bVar7 = absl::lts_20250127::container_internal::operator==
                      ((const_iterator *)&local_a0,&local_60);
    if (!bVar7) {
      pEVar11 = absl::lts_20250127::container_internal::
                raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>
                ::iterator::operator*((iterator *)&local_a0);
      return pEVar11;
    }
  }
  return (ExtensionInfo *)0x0;
}

Assistant:

const ExtensionInfo* FindRegisteredExtension(const MessageLite* extendee,
                                             int number) {
  if (!global_registry) return nullptr;

  ExtensionInfoKey info;
  info.message = extendee;
  info.number = number;

  auto it = global_registry->find(info);
  if (it == global_registry->end()) {
    return nullptr;
  } else {
    return &*it;
  }
}